

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::SetObjectBeforeCollectCallback
          (Recycler *this,void *object,ObjectBeforeCollectCallback callback,void *callbackState,
          ObjectBeforeCollectCallbackWrapper callbackWrapper,void *threadContext)

{
  RealCount *pRVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *buffer;
  bool bVar2;
  ObjectBeforeCollectCallbackList *pOVar3;
  Type pSVar4;
  Type *pTVar5;
  ArenaAllocator *alloc;
  undefined1 local_68 [8];
  EditingIterator iter;
  void *object_local;
  
  if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_Shutdown) {
    pOVar3 = this->objectBeforeCollectCallbackList;
    iter.super_EditingIterator.last = (NodeBase *)object;
    if (pOVar3 == (ObjectBeforeCollectCallbackList *)0x0) {
      if (callback == (ObjectBeforeCollectCallback)0x0) {
        return;
      }
      alloc = &this->objectBeforeCollectCallbackArena;
      pOVar3 = (ObjectBeforeCollectCallbackList *)new<Memory::ArenaAllocator>(0x18,alloc,0x1c1b6c);
      (pOVar3->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pOVar3;
      (pOVar3->
      super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
      ).super_RealCount.count = 0;
      pOVar3->allocator = alloc;
      this->objectBeforeCollectCallbackList = pOVar3;
    }
    else {
      if (callback == (ObjectBeforeCollectCallback)0x0) {
        iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
        local_68 = (undefined1  [8])pOVar3;
        iter.super_EditingIterator.super_Iterator.list =
             &pOVar3->
              super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
        ;
        bVar2 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                ::EditingIterator::Next((EditingIterator *)local_68);
        if (!bVar2) {
          return;
        }
        do {
          pTVar5 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   ::Iterator::Data((Iterator *)local_68);
          buffer = iter.super_EditingIterator.super_Iterator.list;
          if (pTVar5->object == object) {
            this_00 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
                       ((long)local_68 + 0x10);
            SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::UnlinkCurrentNode((EditingIterator *)local_68);
            ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                      (this_00,buffer,0x30);
          }
          bVar2 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                  ::EditingIterator::Next((EditingIterator *)local_68);
        } while (bVar2);
        return;
      }
      alloc = pOVar3->allocator;
    }
    pSVar4 = (Type)new<Memory::ArenaAllocator>(0x30,alloc,0x1c1b6c);
    pSVar4[1].next = (Type)object;
    pSVar4[2].next = (Type)callback;
    pSVar4[3].next = (Type)callbackState;
    pSVar4[4].next = (Type)threadContext;
    pSVar4[5].next = (Type)callbackWrapper;
    pSVar4->next = (pOVar3->
                   super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                   ).super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pOVar3->
    super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
    ).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
    pRVar1 = &(pOVar3->
              super_SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
              ).super_RealCount;
    pRVar1->count = pRVar1->count + 1;
    if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
      ScanMemory<false>(this,&iter.super_EditingIterator.last,8);
      ProcessMark(this,false);
    }
  }
  return;
}

Assistant:

void Recycler::SetObjectBeforeCollectCallback(void* object,
    ObjectBeforeCollectCallback callback,
    void* callbackState,
    ObjectBeforeCollectCallbackWrapper callbackWrapper,
    void* threadContext)
{
    if (objectBeforeCollectCallbackState == ObjectBeforeCollectCallback_Shutdown)
    {
        return; // NOP at shutdown
    }

    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        if (callback == nullptr) return;
        this->objectBeforeCollectCallbackList = Anew(&this->objectBeforeCollectCallbackArena, ObjectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    }

    if (callback)
    {
        this->objectBeforeCollectCallbackList->Push(ObjectBeforeCollectCallbackData(object, callbackWrapper, callback, callbackState, threadContext));

        if (this->IsInObjectBeforeCollectCallback()) // revive
        {
            this->ScanMemory<false>(&object, sizeof(object));
            this->ProcessMark(/*background*/false);
        }
    }
    else
    {
        // null callback means unregister
        FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, callbackData, this->objectBeforeCollectCallbackList, iter)
        {
            if (callbackData.object == object)
            {
                iter.RemoveCurrent();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }

}